

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_INT ref_search_depth_tree(REF_SEARCH ref_search,REF_INT self)

{
  REF_INT RVar1;
  REF_INT RVar2;
  int iVar3;
  
  iVar3 = 0;
  if (self != -1) {
    if (self < 0 || ref_search->n <= self) {
      printf("self invalid %d n %d self\n");
      iVar3 = -1;
    }
    else if (ref_search->item[(uint)self] != -1) {
      RVar1 = ref_search_depth_tree(ref_search,ref_search->left[(uint)self]);
      RVar2 = ref_search_depth_tree(ref_search,ref_search->right[(uint)self]);
      if (RVar2 < RVar1) {
        RVar2 = RVar1;
      }
      iVar3 = RVar2 + 1;
    }
  }
  return iVar3;
}

Assistant:

static REF_INT ref_search_depth_tree(REF_SEARCH ref_search, REF_INT self) {
  REF_INT depth, right, left;
  depth = 0;
  if (REF_EMPTY == self) return depth;
  if (self < 0 || ref_search->n <= self) {
    printf("self invalid %d n %d self\n", ref_search->n, self);
    return REF_EMPTY;
  }
  if (REF_EMPTY == ref_search->item[self]) return depth;
  left = ref_search_depth_tree(ref_search, ref_search->left[self]);
  right = ref_search_depth_tree(ref_search, ref_search->right[self]);
  depth = 1 + MAX(left, right);
  return depth;
}